

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O2

sysbvm_tuple_t sysbvm_float64_parseString(sysbvm_context_t *context,size_t stringSize,char *string)

{
  char *cstring;
  sysbvm_tuple_t sVar1;
  
  cstring = (char *)malloc(stringSize + 1);
  memcpy(cstring,string,stringSize);
  cstring[stringSize] = '\0';
  sVar1 = sysbvm_float64_parseCString(context,cstring);
  free(cstring);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_float64_parseString(sysbvm_context_t *context, size_t stringSize, const char *string)
{
    char *buffer = (char*)malloc(stringSize + 1);
    memcpy(buffer, string, stringSize);
    buffer[stringSize] = 0;

    sysbvm_tuple_t result = sysbvm_float64_parseCString(context, buffer);
    free(buffer);
    return result;
}